

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

uint32_t unicode_cpt_from_utf8(string *utf8,size_t *offset)

{
  byte bVar1;
  invalid_argument *this;
  
  bVar1 = (utf8->_M_dataplus)._M_p[*offset];
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"invalid character");
    }
    else if ((bVar1 & 0x20) == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"invalid character");
    }
    else if ((bVar1 & 0x10) == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"invalid character");
    }
    else if ((bVar1 & 8) == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"invalid character");
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"failed to convert utf8 to codepoint");
    }
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  *offset = *offset + 1;
  return (uint)bVar1;
}

Assistant:

uint32_t unicode_cpt_from_utf8(const std::string & utf8, size_t & offset) {
    assert(offset < utf8.size());
    if (!(utf8[offset + 0] & 0x80)) {
        auto result = utf8[offset + 0];
        offset += 1;
        return result;
    }
    if (!(utf8[offset + 0] & 0x40)) {
        throw std::invalid_argument("invalid character");
    }
    if (!(utf8[offset + 0] & 0x20)) {
        if (offset + 1 >= utf8.size() || ! ((utf8[offset + 1] & 0xc0) == 0x80)) {
            throw std::invalid_argument("invalid character");
        }
        auto result = ((utf8[offset + 0] & 0x1f) << 6) | (utf8[offset + 1] & 0x3f);
        offset += 2;
        return result;
    }
    if (!(utf8[offset + 0] & 0x10)) {
        if (offset + 2 >= utf8.size() || ! ((utf8[offset + 1] & 0xc0) == 0x80) || ! ((utf8[offset + 2] & 0xc0) == 0x80)) {
            throw std::invalid_argument("invalid character");
        }
        auto result = ((utf8[offset + 0] & 0x0f) << 12) | ((utf8[offset + 1] & 0x3f) << 6) | (utf8[offset + 2] & 0x3f);
        offset += 3;
        return result;
    }
    if (!(utf8[offset + 0] & 0x08)) {
        if (offset + 3 >= utf8.size() || ! ((utf8[offset + 1] & 0xc0) == 0x80) || ! ((utf8[offset + 2] & 0xc0) == 0x80) || !((utf8[offset + 3] & 0xc0) == 0x80)) {
            throw std::invalid_argument("invalid character");
        }
        auto result = ((utf8[offset + 0] & 0x07) << 18) | ((utf8[offset + 1] & 0x3f) << 12) | ((utf8[offset + 2] & 0x3f) << 6) | (utf8[offset + 3] & 0x3f);
        offset += 4;
        return result;
    }
    throw std::invalid_argument("failed to convert utf8 to codepoint");
}